

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O2

Promise<void> __thiscall
capnp::Request<capnp::DynamicStruct,_capnp::DynamicStruct>::sendStreaming
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *this)

{
  long in_RSI;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  _kjCondition.value = StructSchema::isStreamResult((StructSchema *)(in_RSI + 0x40));
  if (_kjCondition.value) {
    (**(code **)(**(long **)(in_RSI + 0x38) + 8))(this);
    kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
              ((Own<capnp::RequestHook,_std::nullptr_t> *)(in_RSI + 0x30));
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++"
             ,0x67,FAILED,"resultSchema.isStreamResult()","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Promise<void> Request<DynamicStruct, DynamicStruct>::sendStreaming() {
  KJ_REQUIRE(resultSchema.isStreamResult());

  auto promise = hook->sendStreaming();
  hook = nullptr;  // prevent reuse
  return promise;
}